

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_GlassBreak(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  FState *pFVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  PClassActor *type;
  AActor *pAVar5;
  undefined8 *puVar6;
  long lVar7;
  int iVar8;
  double dVar9;
  bool quest2;
  bool quest1;
  bool local_7a;
  bool local_79;
  double local_78;
  double local_70;
  FName local_64;
  double local_60;
  double local_58;
  AActor *local_50;
  DVector3 local_48;
  
  ln->flags = ln->flags & 0xffff7ffe;
  bVar2 = P_ChangeSwitchTexture(ln->sidedef[0],0,'\0',&local_79);
  ln->special = 0;
  if (ln->sidedef[1] == (side_t *)0x0) {
    local_7a = local_79;
  }
  else {
    bVar3 = P_ChangeSwitchTexture(ln->sidedef[1],0,'\0',&local_7a);
    bVar2 = bVar2 || bVar3;
  }
  if (bVar2 != false) {
    local_50 = it;
    if (arg0 == 0) {
      local_58 = ((ln->v1->p).X + (ln->v2->p).X) * 0.5;
      local_70 = ((ln->v1->p).Y + (ln->v2->p).Y) * 0.5;
      local_78 = (ln->delta).Y;
      local_60 = (ln->delta).X;
      dVar9 = c_sqrt(local_60 * local_60 + local_78 * local_78);
      dVar9 = (double)(~-(ulong)(dVar9 != 0.0) & (ulong)dVar9 |
                      (ulong)(1.0 / dVar9) & -(ulong)(dVar9 != 0.0));
      local_78 = local_78 * dVar9;
      dVar9 = dVar9 * local_60;
      local_78 = local_78 + local_78 + local_58;
      local_70 = local_70 - (dVar9 + dVar9);
      iVar8 = 7;
      do {
        local_64.Index = FName::NameManager::FindName(&FName::NameData,"GlassJunk",false);
        local_48.X = local_78;
        local_48.Y = local_70;
        local_48.Z = -2147483648.0;
        type = ClassForSpawn(&local_64);
        pAVar5 = AActor::StaticSpawn(type,&local_48,ALLOW_REPLACE,false);
        (pAVar5->__Pos).Z = (pAVar5->__Pos).Z + 24.0;
        pFVar1 = pAVar5->SpawnState;
        uVar4 = FRandom::GenRand32(&pr_glass);
        AActor::SetState(pAVar5,(FState *)
                                (&pFVar1->NextState +
                                (((long)(ulong)(uVar4 & 0xff) % (long)pAVar5->health & 0xffffffffU)
                                 * 5 & 0xffffffff)),false);
        uVar4 = FRandom::GenRand32(&pr_glass);
        (pAVar5->Angles).Yaw.Degrees = (double)(uVar4 & 0xff) * 1.40625;
        uVar4 = FRandom::GenRand32(&pr_glass);
        AActor::VelFromAngle(pAVar5,(double)(uVar4 & 3));
        uVar4 = FRandom::GenRand32(&pr_glass);
        (pAVar5->Vel).Z = (double)(uVar4 & 7);
        uVar4 = FRandom::GenRand32(&pr_glass);
        pAVar5->tics = pAVar5->tics + (uVar4 & 0xff);
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
    if ((local_79 != false) || (local_7a == true)) {
      pAVar5 = local_50;
      if (local_50 == (AActor *)0x0) {
        puVar6 = &players;
        pAVar5 = (AActor *)0x0;
        lVar7 = 0;
        do {
          if (playeringame[lVar7] == true) {
            pAVar5 = (AActor *)*puVar6;
            break;
          }
          lVar7 = lVar7 + 1;
          puVar6 = puVar6 + 0x54;
        } while (lVar7 != 8);
      }
      if (pAVar5 != (AActor *)0x0) {
        AActor::GiveInventoryType(pAVar5,QuestItemClasses[0x1c]);
        AActor::GiveInventoryType(pAVar5,(PClassActor *)AUpgradeAccuracy::RegistrationInfo.MyClass);
        AActor::GiveInventoryType(pAVar5,(PClassActor *)AUpgradeStamina::RegistrationInfo.MyClass);
      }
    }
  }
  return 0;
}

Assistant:

FUNC(LS_GlassBreak)
// GlassBreak (bNoJunk)
{
	bool switched;
	bool quest1, quest2;

	ln->flags &= ~(ML_BLOCKING|ML_BLOCKEVERYTHING);
	switched = P_ChangeSwitchTexture (ln->sidedef[0], false, 0, &quest1);
	ln->special = 0;
	if (ln->sidedef[1] != NULL)
	{
		switched |= P_ChangeSwitchTexture (ln->sidedef[1], false, 0, &quest2);
	}
	else
	{
		quest2 = quest1;
	}
	if (switched)
	{
		if (!arg0)
		{ // Break some glass
			AActor *glass;

			DVector2 linemid((ln->v1->fX() + ln->v2->fX()) / 2, (ln->v1->fY() + ln->v2->fY()) / 2);

			// remove dependence on sector size and always spawn 2 map units in front of the line.
			DVector2 normal(ln->Delta().Y, -ln->Delta().X);
			linemid += normal.Unit() * 2;
			/* old code:
			x += (ln->frontsector->centerspot.x - x) / 5;
			y += (ln->frontsector->centerspot.y - y) / 5;
			*/

			for (int i = 0; i < 7; ++i)
			{
				glass = Spawn("GlassJunk", DVector3(linemid, ONFLOORZ), ALLOW_REPLACE);

				glass->AddZ(24.);
				glass->SetState (glass->SpawnState + (pr_glass() % glass->health));

				glass->Angles.Yaw = pr_glass() * (360 / 256.);
				glass->VelFromAngle(pr_glass() & 3);
				glass->Vel.Z = (pr_glass() & 7);
				// [RH] Let the shards stick around longer than they did in Strife.
				glass->tics += pr_glass();
			}
		}
		if (quest1 || quest2)
		{ // Up stats and signal this mission is complete
			if (it == NULL)
			{
				for (int i = 0; i < MAXPLAYERS; ++i)
				{
					if (playeringame[i])
					{
						it = players[i].mo;
						break;
					}
				}
			}
			if (it != NULL)
			{
				it->GiveInventoryType (QuestItemClasses[28]);
				it->GiveInventoryType (RUNTIME_CLASS(AUpgradeAccuracy));
				it->GiveInventoryType (RUNTIME_CLASS(AUpgradeStamina));
			}
		}
	}
	// We already changed the switch texture, so don't make the main code switch it back.
	return false;
}